

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

MessageProcessingResult __thiscall
helics::FederateState::processActionMessage(FederateState *this,ActionMessage *cmd)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  MessageProcessingResult MVar2;
  FederateStates FVar3;
  FederateStates FVar4;
  action_t aVar5;
  GlobalFederateId GVar6;
  GlobalFederateId id;
  int iVar7;
  MessageProcessingResult *pMVar8;
  pointer pTVar9;
  Time TVar10;
  FederateState *in_RSI;
  Time in_RDI;
  __sv_type _Var11;
  string_view sVar12;
  FederateState *unaff_retaddr;
  ActionMessage *in_stack_000000b0;
  FederateState *in_stack_000000b8;
  ActionMessage queryResp;
  MessageProcessingResult ret_2;
  Time lastTime;
  MessageProcessingResult ret_1;
  optional<helics::MessageProcessingResult> result;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  MessageProcessingResult ret;
  IterationRequest iterate;
  ActionMessage *in_stack_000005e0;
  FederateState *in_stack_000005e8;
  FederateState *in_stack_00000968;
  string_view in_stack_00000970;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  int32_t iVar13;
  int in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 uVar14;
  GlobalFederateId in_stack_fffffffffffffccc;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  ActionMessage *in_stack_fffffffffffffcd8;
  FederateState *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  FederateState *in_stack_fffffffffffffcf0;
  GlobalFederateId *pGVar16;
  FederateState *in_stack_fffffffffffffcf8;
  undefined6 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 in_stack_fffffffffffffd1f;
  IterationRequest iterate_00;
  undefined5 in_stack_fffffffffffffd28;
  undefined1 uVar17;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  Time in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  GlobalFederateId in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffda6;
  FederateStates in_stack_fffffffffffffda7;
  TimeCoordinator *in_stack_fffffffffffffda8;
  ActionMessage *in_stack_fffffffffffffdb0;
  GlobalFederateId in_stack_fffffffffffffdbc;
  InterfaceInfo *in_stack_fffffffffffffdc0;
  Time in_stack_fffffffffffffdc8;
  GlobalFederateId in_stack_fffffffffffffdd4;
  ActionMessage *in_stack_fffffffffffffde8;
  FederateState *in_stack_fffffffffffffdf0;
  GlobalFederateId local_1b4;
  undefined4 in_stack_fffffffffffffe50;
  GlobalFederateId in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  GlobalFederateId in_stack_fffffffffffffe5c;
  string_view in_stack_fffffffffffffe60;
  string_view in_stack_fffffffffffffe70;
  GlobalFederateId local_170;
  int in_stack_fffffffffffffe94;
  FederateState *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  FederateState *in_stack_fffffffffffffeb0;
  GlobalFederateId local_144;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  GlobalFederateId local_138;
  MessageProcessingResult local_131;
  BaseType local_130;
  _Optional_payload_base<helics::MessageProcessingResult> local_12a;
  BaseType local_128;
  MessageProcessingResult local_121;
  baseType local_120;
  baseType local_118;
  TimeCoordinator *local_110;
  undefined1 local_101;
  BaseType local_100;
  format_args in_stack_ffffffffffffff10;
  string_view in_stack_ffffffffffffff20;
  undefined1 local_c0 [32];
  __sv_type local_a0;
  ActionMessage *in_stack_ffffffffffffff70;
  FederateState *this_00;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  char *local_48;
  undefined8 uStack_40;
  Time local_30;
  char *local_28;
  Time TStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  ActionMessage *in_stack_fffffffffffffff8;
  
  uVar17 = (undefined1)((uint)in_stack_fffffffffffffe50 >> 0x18);
  this_00 = (FederateState *)in_RDI.internalTimeCode;
  if (0x17 < ((FederateState *)in_RDI.internalTimeCode)->maxLogLevel) {
    _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffcb0);
    in_stack_ffffffffffffff70 = (ActionMessage *)_Var11._M_str;
    in_stack_fffffffffffffd38.internalTimeCode = (baseType)&stack0xffffffffffffff10;
    prettyPrintString_abi_cxx11_((ActionMessage *)_Var11._M_len);
    local_18 = local_c0;
    local_28 = "processing command {}";
    TStack_20.internalTimeCode = 0x15;
    local_48 = "processing command {}";
    uStack_40._0_2_ = 0x15;
    uStack_40._2_2_ = 0;
    uStack_40._4_4_ = 0;
    local_30.internalTimeCode = in_stack_fffffffffffffd38.internalTimeCode;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffff8 = (ActionMessage *)local_58;
    local_10 = local_68;
    local_58._0_4_ = cmd_init_not_ready|cmd_tick;
    local_58._4_4_ = 0;
    local_58._8_8_ = local_10;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_ffffffffffffff20,in_stack_ffffffffffffff10);
    local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffcb0);
    in_stack_fffffffffffffca8 = 0;
    logMessage((FederateState *)CONCAT44(in_stack_fffffffffffffe5c.gid,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54.gid,in_stack_fffffffffffffe70,in_stack_fffffffffffffe60,
               (bool)uVar17);
    std::__cxx11::string::~string(in_stack_fffffffffffffcb0);
    std::__cxx11::string::~string(in_stack_fffffffffffffcb0);
  }
  aVar5 = ActionMessage::action((ActionMessage *)in_RSI);
  if (aVar5 == cmd_time_request) {
    TVar10.internalTimeCode = (baseType)&(in_RSI->name)._M_string_length;
    local_100 = (BaseType)
                std::atomic<helics::GlobalFederateId>::load
                          (&((FederateState *)in_RDI.internalTimeCode)->global_id,seq_cst);
    bVar1 = GlobalFederateId::operator==
                      ((GlobalFederateId *)TVar10.internalTimeCode,(GlobalFederateId)local_100);
    if ((bVar1) &&
       (bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                          ((ActionMessage *)in_RSI,indicator_flag), bVar1)) {
      std::atomic<bool>::store
                ((atomic<bool> *)in_stack_fffffffffffffcb8,
                 SUB81((ulong)in_stack_fffffffffffffcb0 >> 0x38,0),
                 (memory_order)in_stack_fffffffffffffcb0);
      local_101 = 0;
      bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                        ((ActionMessage *)in_RSI,iteration_requested_flag);
      if (bVar1) {
        bVar1 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                          ((ActionMessage *)in_RSI,required_flag);
        in_stack_fffffffffffffd2e = 2;
        in_stack_fffffffffffffd2f = 1;
        local_101 = in_stack_fffffffffffffd2f;
        if (!bVar1) {
          in_stack_fffffffffffffd2f = 2;
          local_101 = in_stack_fffffffffffffd2f;
        }
      }
      pTVar9 = std::
               unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
               operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           *)0x5a3088);
      iterate_00 = (IterationRequest)((ulong)pTVar9 >> 0x38);
      local_110 = (in_RSI->timeCoord)._M_t.
                  super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                  .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      uVar17 = local_101;
      local_118 = (baseType)
                  nextValueTime((FederateState *)
                                CONCAT17(in_stack_fffffffffffffd1f,
                                         CONCAT16(in_stack_fffffffffffffd1e,
                                                  in_stack_fffffffffffffd18)));
      local_120 = (baseType)
                  nextMessageTime((FederateState *)
                                  CONCAT17(in_stack_fffffffffffffd1f,
                                           CONCAT16(in_stack_fffffffffffffd1e,
                                                    in_stack_fffffffffffffd18)));
      TimeCoordinator::timeRequest
                ((TimeCoordinator *)
                 CONCAT17(in_stack_fffffffffffffd2f,
                          CONCAT16(in_stack_fffffffffffffd2e,
                                   CONCAT15(uVar17,in_stack_fffffffffffffd28))),in_RDI,iterate_00,
                 in_stack_fffffffffffffd38,TVar10);
      ((FederateState *)in_RDI.internalTimeCode)->timeGranted_mode = false;
      local_121 = processDelayQueue(in_stack_fffffffffffffcf0);
      bVar1 = returnableResult(local_121);
      if (bVar1) {
        return local_121;
      }
      ActionMessage::setAction((ActionMessage *)in_RSI,cmd_time_check);
    }
  }
  std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::get
            ((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *)
             in_stack_fffffffffffffcb0);
  getState((FederateState *)0x5a318d);
  local_128 = (BaseType)
              std::atomic<helics::GlobalFederateId>::load
                        (&((FederateState *)in_RDI.internalTimeCode)->global_id,seq_cst);
  processCoordinatorMessage
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda7,
             (bool)in_stack_fffffffffffffda6,in_stack_fffffffffffffdbc);
  local_12a = (_Optional_payload_base<helics::MessageProcessingResult>)
              checkProcResult(in_stack_fffffffffffffeb0,
                              (tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool>
                               *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              (ActionMessage *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<helics::MessageProcessingResult> *)0x5a321c);
  if (bVar1) {
    pMVar8 = std::optional<helics::MessageProcessingResult>::operator*
                       ((optional<helics::MessageProcessingResult> *)0x5a322f);
    return *pMVar8;
  }
  GVar6.gid = ActionMessage::action((ActionMessage *)in_RSI);
  if (GVar6.gid == cmd_query) {
LAB_005a3ccc:
    ActionMessage::action((ActionMessage *)in_RSI);
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffccc.gid);
    sVar12 = SmallBuffer::to_string((SmallBuffer *)0x5a3d53);
    processQueryActual_abi_cxx11_(in_stack_00000968,in_stack_00000970);
    SmallBuffer::operator=
              ((SmallBuffer *)in_stack_fffffffffffffcd8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar12._M_str);
    routeMessage(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    ActionMessage::~ActionMessage((ActionMessage *)sVar12._M_str);
    return CONTINUE_PROCESSING;
  }
  if (GVar6.gid == cmd_send_command) {
LAB_005a3cb2:
    sendCommand(in_stack_000005e8,in_stack_000005e0);
    return CONTINUE_PROCESSING;
  }
  if (GVar6.gid == cmd_fed_ack) {
    FVar3 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x5a3953)
    ;
    FVar4 = (FederateStates)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
    if (FVar3 != CREATED) {
      return CONTINUE_PROCESSING;
    }
    ActionMessage::name((ActionMessage *)0x5a3969);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffcb0);
    __x._M_str = (char *)in_stack_fffffffffffffce0;
    __x._M_len = (size_t)in_stack_fffffffffffffcd8;
    __y._M_len._4_4_ = in_stack_fffffffffffffccc.gid;
    __y._M_len._0_4_ = in_stack_fffffffffffffcc8;
    __y._M_str._0_4_ = in_stack_fffffffffffffcd0;
    __y._M_str._4_4_ = in_stack_fffffffffffffcd4;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      return CONTINUE_PROCESSING;
    }
    bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                      ((ActionMessage *)in_RSI,error_flag);
    if (bVar1) {
      setState((FederateState *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),FVar4)
      ;
      commandErrorString(in_stack_fffffffffffffcc4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffcb0,
                 (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      return ERROR_RESULT;
    }
    bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      ((ActionMessage *)in_RSI,global_timing_flag);
    if (bVar1) {
      bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                        ((ActionMessage *)in_RSI,async_timing_flag);
      if (bVar1) {
        ((FederateState *)in_RDI.internalTimeCode)->timeMethod = ASYNC;
      }
      else {
        ((FederateState *)in_RDI.internalTimeCode)->timeMethod = GLOBAL;
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffe5c,(GlobalBrokerId)0x1);
        addDependent((FederateState *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffe54,(GlobalBrokerId)0x1);
        addDependency((FederateState *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                      ,(GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pTVar9 = std::
                 unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                               *)0x5a3af3);
        GVar6.gid = (BaseType)((ulong)pTVar9 >> 0x20);
        GlobalFederateId::GlobalFederateId(&local_1b4,(GlobalBrokerId)0x1);
        BaseTimeCoordinator::setAsParent
                  ((BaseTimeCoordinator *)
                   CONCAT44(in_stack_fffffffffffffccc.gid,in_stack_fffffffffffffcc8),GVar6);
      }
      pTVar9 = std::
               unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
               operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           *)0x5a3b3b);
      pTVar9->globalTime = true;
    }
    std::atomic<helics::GlobalFederateId>::operator=
              ((atomic<helics::GlobalFederateId> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
               (GlobalFederateId)(BaseType)in_stack_fffffffffffffcb0);
    InterfaceInfo::setGlobalId
              ((InterfaceInfo *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
               (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    pTVar9 = std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           *)0x5a3bae);
    uVar14 = SUB84(pTVar9,0);
    uVar15 = (undefined4)((ulong)pTVar9 >> 0x20);
    GVar6 = std::atomic::operator_cast_to_GlobalFederateId
                      ((atomic<helics::GlobalFederateId> *)
                       CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    BaseTimeCoordinator::setSourceId((BaseTimeCoordinator *)CONCAT44(uVar15,uVar14),GVar6);
    return NEXT_STEP;
  }
  if (GVar6.gid == cmd_ignore) {
    return CONTINUE_PROCESSING;
  }
  if (GVar6.gid == cmd_user_disconnect) {
LAB_005a34fb:
    FVar3 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x5a350c)
    ;
    FVar4 = (FederateStates)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
    if (FVar3 == FINISHED) {
      return CONTINUE_PROCESSING;
    }
    FVar3 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x5a3525)
    ;
    if (FVar3 == TERMINATING) {
      return CONTINUE_PROCESSING;
    }
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x5a353e);
    BaseTimeCoordinator::disconnect
              ((BaseTimeCoordinator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
    ;
    GlobalFederateId::GlobalFederateId(&local_138,(GlobalBrokerId)0x0);
    *(BaseType *)&(in_RSI->name).field_2 = local_138.gid;
    FVar3 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x5a358a)
    ;
    if (FVar3 != ERRORED) {
      setState((FederateState *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),FVar4)
      ;
    }
    routeMessage(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    return CONTINUE_PROCESSING;
  }
  if ((GVar6.gid == cmd_disconnect) || (GVar6.gid == cmd_disconnect_fed)) {
    pGVar16 = (GlobalFederateId *)&(in_RSI->name)._M_string_length;
    id = std::atomic<helics::GlobalFederateId>::load
                   (&((FederateState *)in_RDI.internalTimeCode)->global_id,seq_cst);
    FVar3 = (FederateStates)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
    bVar1 = GlobalFederateId::operator==(pGVar16,id);
    if (bVar1) {
      FVar4 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x5a3613);
      if (FVar4 == FINISHED) {
        return CONTINUE_PROCESSING;
      }
      FVar4 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x5a362c);
      if (FVar4 == TERMINATING) {
        return CONTINUE_PROCESSING;
      }
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x5a3645);
      BaseTimeCoordinator::disconnect
                ((BaseTimeCoordinator *)CONCAT44(in_stack_fffffffffffffec4,id.gid));
      GlobalFederateId::GlobalFederateId(&local_144,(GlobalBrokerId)0x0);
      *(BaseType *)&(in_RSI->name).field_2 = local_144.gid;
      FVar4 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x5a3691);
      if (FVar4 != ERRORED) {
        setState((FederateState *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 FVar3);
      }
      routeMessage(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      return CONTINUE_PROCESSING;
    }
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x5a36d7);
    BaseTimeCoordinator::getLastGrant
              ((BaseTimeCoordinator *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               in_stack_fffffffffffffccc);
    pTVar9 = std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           *)0x5a370a);
    iVar7 = (*(pTVar9->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(pTVar9,in_RSI);
    if ((char)iVar7 == '\0') {
      return CONTINUE_PROCESSING;
    }
    if ((char)iVar7 != '\x05') {
      FVar3 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x5a3787);
      if (FVar3 != EXECUTING) {
        return CONTINUE_PROCESSING;
      }
      InterfaceInfo::disconnectFederate
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
      if ((((FederateState *)in_RDI.internalTimeCode)->timeGranted_mode & 1U) != 0) {
        return CONTINUE_PROCESSING;
      }
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x5a37f8);
      memset(&local_170,0,4);
      GlobalFederateId::GlobalFederateId(&local_170);
      MVar2 = TimeCoordinator::checkTimeGrant
                        ((TimeCoordinator *)
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         in_stack_fffffffffffffd80);
      bVar1 = returnableResult(MVar2);
      if (!bVar1) {
        return CONTINUE_PROCESSING;
      }
      pTVar9 = std::
               unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
               operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           *)0x5a385d);
      TVar10 = TimeCoordinator::getGrantedTime(pTVar9);
      (((FederateState *)in_RDI.internalTimeCode)->time_granted).internalTimeCode =
           TVar10.internalTimeCode;
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x5a388d);
      TVar10 = TimeCoordinator::allowedSendTime
                         ((TimeCoordinator *)
                          CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      (((FederateState *)in_RDI.internalTimeCode)->allowed_send_time).internalTimeCode =
           TVar10.internalTimeCode;
      ((FederateState *)in_RDI.internalTimeCode)->timeGranted_mode = true;
      return MVar2;
    }
    addFederateToDelay(in_stack_fffffffffffffcf8,GVar6);
    return DELAY_MESSAGE;
  }
  if (GVar6.gid == cmd_exec_request) {
    pGVar16 = (GlobalFederateId *)&(in_RSI->name)._M_string_length;
    local_130 = (BaseType)
                std::atomic<helics::GlobalFederateId>::load
                          (&((FederateState *)in_RDI.internalTimeCode)->global_id,seq_cst);
    bVar1 = GlobalFederateId::operator==(pGVar16,(GlobalFederateId)local_130);
    if (!bVar1) {
      return CONTINUE_PROCESSING;
    }
    bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                      ((ActionMessage *)in_RSI,indicator_flag);
    if (!bVar1) {
      return CONTINUE_PROCESSING;
    }
    local_131 = processDelayQueue(in_stack_fffffffffffffcf0);
    bVar1 = returnableResult(local_131);
    if (bVar1) {
      return local_131;
    }
    ActionMessage::setAction((ActionMessage *)in_RSI,cmd_exec_check);
    MVar2 = processActionMessage(in_RSI,in_stack_ffffffffffffff70);
    return MVar2;
  }
  if (GVar6.gid != cmd_add_publisher) {
    if (GVar6.gid == cmd_pub) {
LAB_005a38da:
      processDataMessage((FederateState *)queryResp.payload.buffer._M_elems._24_8_,
                         (ActionMessage *)queryResp.payload.buffer._M_elems._16_8_);
      return CONTINUE_PROCESSING;
    }
    if (GVar6.gid == cmd_log) {
LAB_005a38f4:
      processLoggingMessage(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      return CONTINUE_PROCESSING;
    }
    if ((GVar6.gid != cmd_add_subscriber) && (GVar6.gid != cmd_add_endpoint)) {
      if (GVar6.gid == cmd_send_command_ordered) goto LAB_005a3cb2;
      if (((GVar6.gid != cmd_remove_named_publication) && (1 < (uint)(GVar6.gid + 0xffffff7b))) &&
         (1 < (uint)(GVar6.gid + ~cmd_remove_filter))) {
        if (GVar6.gid == cmd_fed_configure_time) {
          TVar10.internalTimeCode._4_4_ = in_stack_fffffffffffffea4;
          TVar10.internalTimeCode._0_4_ = in_stack_fffffffffffffea0;
          setProperty(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,TVar10);
          return CONTINUE_PROCESSING;
        }
        if (GVar6.gid == cmd_fed_configure_int) {
          ActionMessage::getExtraData((ActionMessage *)0x5a3c43);
          setProperty(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
          ;
          return CONTINUE_PROCESSING;
        }
        if (GVar6.gid == cmd_fed_configure_flag) {
          iVar13 = *(int32_t *)((long)&(in_RSI->name)._M_dataplus._M_p + 4);
          checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                    ((ActionMessage *)in_RSI,indicator_flag);
          setOptionFlag((FederateState *)CONCAT44(in_stack_fffffffffffffcc4,iVar13),
                        (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                        SUB81((ulong)in_stack_fffffffffffffcb8 >> 0x18,0));
          return CONTINUE_PROCESSING;
        }
        if (GVar6.gid == cmd_interface_configure) {
          setInterfaceProperty(this_00,(ActionMessage *)in_RSI);
          return CONTINUE_PROCESSING;
        }
        if (GVar6.gid == cmd_grant_timeout_check) {
          timeoutCheck(in_stack_000000b8,in_stack_000000b0);
          return CONTINUE_PROCESSING;
        }
        if (GVar6.gid != cmd_set_profiler_flag) {
          if (GVar6.gid == cmd_query_ordered) goto LAB_005a3ccc;
          if (GVar6.gid == cmd_global_disconnect) goto LAB_005a34fb;
          if (((GVar6.gid != cmd_timeout_disconnect) && (GVar6.gid != cmd_remote_log)) &&
             (GVar6.gid != cmd_warning)) {
            if (GVar6.gid != cmd_send_message) {
              return CONTINUE_PROCESSING;
            }
            goto LAB_005a38da;
          }
        }
        goto LAB_005a38f4;
      }
    }
  }
  processDataConnectionMessage(unaff_retaddr,in_stack_fffffffffffffff8);
  return CONTINUE_PROCESSING;
}

Assistant:

MessageProcessingResult FederateState::processActionMessage(ActionMessage& cmd)
{
    LOG_TRACE(fmt::format("processing command {}", prettyPrintString(cmd)));

    if (cmd.action() == CMD_TIME_REQUEST) {
        if ((cmd.source_id == global_id.load()) &&
            checkActionFlag(cmd, indicator_flag)) {  // this sets up a time request
            requestingMode.store(true);
            IterationRequest iterate = IterationRequest::NO_ITERATIONS;
            if (checkActionFlag(cmd, iteration_requested_flag)) {
                iterate = (checkActionFlag(cmd, required_flag)) ?
                    IterationRequest::FORCE_ITERATION :
                    IterationRequest::ITERATE_IF_NEEDED;
            }
            timeCoord->timeRequest(cmd.actionTime, iterate, nextValueTime(), nextMessageTime());
            timeGranted_mode = false;
            auto ret = processDelayQueue();
            if (returnableResult(ret)) {
                return ret;
            }
            cmd.setAction(CMD_TIME_CHECK);
        }
    }
    auto proc_result = processCoordinatorMessage(
        cmd, timeCoord.get(), getState(), timeGranted_mode, global_id.load());

    auto result = checkProcResult(proc_result, cmd);
    if (result) {
        return *result;
    }

    switch (cmd.action()) {
        case CMD_IGNORE:
        default:
            break;

        case CMD_EXEC_REQUEST:
            if ((cmd.source_id == global_id.load()) &&
                checkActionFlag(cmd, indicator_flag)) {  // this sets up a time request
                auto ret = processDelayQueue();
                if (returnableResult(ret)) {
                    return ret;
                }
                cmd.setAction(CMD_EXEC_CHECK);
                return processActionMessage(cmd);
            }
            break;
        case CMD_GLOBAL_DISCONNECT:
        case CMD_USER_DISCONNECT:
            if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                timeCoord->disconnect();
                cmd.dest_id = parent_broker_id;
                if (state != FederateStates::ERRORED) {
                    setState(FederateStates::TERMINATING);
                }
                routeMessage(cmd);
            }
            break;
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT:
            if (cmd.source_id == global_id.load()) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                    cmd.dest_id = parent_broker_id;
                    if (state != FederateStates::ERRORED) {
                        setState(FederateStates::TERMINATING);
                    }
                    routeMessage(cmd);
                }
            } else {
                const Time lastTime = timeCoord->getLastGrant(cmd.source_id);
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        addFederateToDelay(cmd.source_id);
                        return MessageProcessingResult::DELAY_MESSAGE;
                    case TimeProcessingResult::NOT_PROCESSED:
                        return MessageProcessingResult::CONTINUE_PROCESSING;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }

                interfaceInformation.disconnectFederate(cmd.source_id, lastTime);
                if (!timeGranted_mode) {
                    auto ret = timeCoord->checkTimeGrant();
                    if (returnableResult(ret)) {
                        time_granted = timeCoord->getGrantedTime();
                        allowed_send_time = timeCoord->allowedSendTime();
                        timeGranted_mode = true;
                        return ret;
                    }
                }
            }
            break;
        case CMD_SEND_MESSAGE:
        case CMD_PUB:
            processDataMessage(cmd);
            break;
        case CMD_LOG:
        case CMD_REMOTE_LOG:
        case CMD_WARNING:
        case CMD_SET_PROFILER_FLAG:
        case CMD_TIMEOUT_DISCONNECT:
            processLoggingMessage(cmd);
            break;
        case CMD_GRANT_TIMEOUT_CHECK:
            timeoutCheck(cmd);
            break;
        case CMD_ADD_PUBLISHER:
        case CMD_ADD_SUBSCRIBER:
        case CMD_ADD_ENDPOINT:
        case CMD_REMOVE_NAMED_PUBLICATION:
        case CMD_REMOVE_PUBLICATION:
        case CMD_REMOVE_SUBSCRIBER:
        case CMD_REMOVE_ENDPOINT:
        case CMD_CLOSE_INTERFACE:
            processDataConnectionMessage(cmd);
            break;

        case CMD_FED_ACK:
            if (state != FederateStates::CREATED) {
                break;
            }
            if (cmd.name() == name) {
                if (checkActionFlag(cmd, error_flag)) {
                    setState(FederateStates::ERRORED);
                    errorString = commandErrorString(cmd.messageID);
                    return MessageProcessingResult::ERROR_RESULT;
                }
                if (checkActionFlag(cmd, global_timing_flag)) {
                    if (checkActionFlag(cmd, async_timing_flag)) {
                        timeMethod = TimeSynchronizationMethod::ASYNC;
                    } else {
                        timeMethod = TimeSynchronizationMethod::GLOBAL;
                        addDependent(gRootBrokerID);
                        addDependency(gRootBrokerID);
                        timeCoord->setAsParent(gRootBrokerID);
                    }
                    timeCoord->globalTime = true;
                }
                global_id = cmd.dest_id;
                interfaceInformation.setGlobalId(cmd.dest_id);
                timeCoord->setSourceId(global_id);
                return MessageProcessingResult::NEXT_STEP;
            }
            break;
        case CMD_FED_CONFIGURE_TIME:
            setProperty(cmd.messageID, cmd.actionTime);
            break;
        case CMD_FED_CONFIGURE_INT:
            setProperty(cmd.messageID, cmd.getExtraData());
            break;
        case CMD_FED_CONFIGURE_FLAG:
            setOptionFlag(cmd.messageID, checkActionFlag(cmd, indicator_flag));
            break;
        case CMD_INTERFACE_CONFIGURE:
            setInterfaceProperty(cmd);
            break;
        case CMD_SEND_COMMAND:
        case CMD_SEND_COMMAND_ORDERED:
            sendCommand(cmd);
            break;

        case CMD_QUERY_ORDERED:
        case CMD_QUERY: {
            ActionMessage queryResp(cmd.action() == CMD_QUERY ? CMD_QUERY_REPLY :
                                                                CMD_QUERY_REPLY_ORDERED);
            queryResp.dest_id = cmd.source_id;
            queryResp.source_id = cmd.dest_id;
            queryResp.messageID = cmd.messageID;
            queryResp.counter = cmd.counter;

            queryResp.payload = processQueryActual(cmd.payload.to_string());
            routeMessage(std::move(queryResp));
        } break;
    }
    return MessageProcessingResult::CONTINUE_PROCESSING;
}